

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O1

BOOL Internal_AddPaddingW(LPWSTR *Out,INT Count,LPWSTR In,INT Padding,INT Flags)

{
  LPWSTR pWVar1;
  int iVar2;
  errno_t eVar3;
  size_t sVar4;
  int iVar5;
  LPWSTR pWVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  
  pWVar1 = *Out;
  sVar4 = PAL_wcslen(In);
  iVar8 = 0;
  if (0 < Padding) {
    iVar8 = Padding;
  }
  iVar2 = (int)sVar4;
  if ((Flags & 1U) != 0) {
    iVar9 = Count + -1;
    iVar5 = iVar2 + 1;
    if (iVar9 <= iVar2 + 1) {
      iVar5 = iVar9;
    }
    eVar3 = wcsncpy_s((char16_t_conflict *)*Out,(long)Count,(char16_t_conflict *)In,(long)iVar5);
    if (eVar3 != 0) {
      return 0;
    }
    if (iVar2 <= iVar9) {
      iVar9 = iVar2;
    }
    *Out = *Out + iVar9;
  }
  if (0 < Padding) {
    lVar7 = (long)*Out - (long)pWVar1;
    pWVar6 = *Out + 1;
    if ((Flags & 4U) == 0) {
      do {
        if ((long)Count <= lVar7 >> 1) break;
        lVar7 = lVar7 + 2;
        *Out = pWVar6;
        pWVar6[-1] = L' ';
        pWVar6 = pWVar6 + 1;
        Padding = Padding + -1;
      } while (Padding != 0);
    }
    else {
      do {
        if ((long)Count <= lVar7 >> 1) break;
        lVar7 = lVar7 + 2;
        *Out = pWVar6;
        pWVar6[-1] = L'0';
        pWVar6 = pWVar6 + 1;
        Padding = Padding + -1;
      } while (Padding != 0);
    }
  }
  if ((Flags & 1U) == 0) {
    lVar11 = (long)Count;
    lVar7 = (long)*Out - (long)pWVar1 >> 1;
    sVar10 = (size_t)iVar2;
    sVar4 = (lVar11 - lVar7) - 1;
    if ((long)sVar10 < (long)sVar4) {
      sVar4 = sVar10;
    }
    eVar3 = wcsncpy_s((char16_t_conflict *)*Out,lVar11 - lVar7,(char16_t_conflict *)In,sVar4);
    if (eVar3 != 0) {
      return 0;
    }
    sVar4 = ~((long)*Out - (long)pWVar1 >> 1) + lVar11;
    if ((long)sVar10 < (long)sVar4) {
      sVar4 = sVar10;
    }
    *Out = *Out + sVar4;
  }
  return (uint)(iVar8 + iVar2 <= Count + -1);
}

Assistant:

BOOL Internal_AddPaddingW(LPWSTR *Out, INT Count, LPWSTR In, INT Padding, INT Flags)
{
    LPWSTR OutOriginal = *Out;
    INT PaddingOriginal = Padding;
    INT LengthInStr;
    LengthInStr = PAL_wcslen(In);


    if (Padding < 0)
    {
        /* this is used at the bottom to determine if the buffer ran out */
        PaddingOriginal = 0;
    }
    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (wcsncpy_s(*Out, Count, In, min(LengthInStr + 1, Count - 1)) != SAFECRT_SUCCESS)
        {
            return FALSE;
        }

        *Out += min(LengthInStr, Count - 1);
    }
    if (Padding > 0)
    {
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding-- && Count > *Out - OutOriginal)
            {
                *(*Out)++ = '0';
            }
        }
        else /* pad left with spaces */
        {
            while (Padding-- && Count > *Out - OutOriginal)
            {
                *(*Out)++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (wcsncpy_s(*Out, Count - (*Out - OutOriginal), In,
            min(LengthInStr, Count - (*Out - OutOriginal) - 1)) != SAFECRT_SUCCESS)
        {
            return FALSE;
        }

        *Out += min(LengthInStr, Count - (*Out - OutOriginal) - 1);
    }

    if (LengthInStr + PaddingOriginal > Count - 1)
    {
        return FALSE;
    }
    else
    {
        return TRUE;
    }
}